

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

ON_MeshNgon * __thiscall
ON_MeshNgonAllocator::AllocateNgon(ON_MeshNgonAllocator *this,uint Vcount,uint Fcount)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  long local_68;
  uint local_3c;
  uint n;
  uint capacity;
  uint *a;
  ON_MeshNgon *ngon;
  ON_MeshNgonLink *link;
  uint Fcount_local;
  uint Vcount_local;
  ON_MeshNgonAllocator *this_local;
  
  if (Vcount < 3) {
    return (ON_MeshNgon *)0x0;
  }
  local_3c = Vcount + Fcount;
  if (local_3c < 8) {
    local_3c = 7;
    sVar2 = SizeofNgon(7);
    sVar3 = ON_FixedSizePool::SizeofElement(&this->m_7);
    if (sVar2 != sVar3) {
      sVar2 = SizeofNgon(7);
      ON_FixedSizePool::Create(&this->m_7,sVar2,0,0);
    }
    a = (uint *)ON_FixedSizePool::AllocateElement(&this->m_7);
    goto LAB_0075077e;
  }
  if (local_3c < 0x10) {
    local_3c = 0xf;
    sVar2 = SizeofNgon(0xf);
    sVar3 = ON_FixedSizePool::SizeofElement(&this->m_15);
    if (sVar2 != sVar3) {
      sVar2 = SizeofNgon(0xf);
      ON_FixedSizePool::Create(&this->m_15,sVar2,0,0);
    }
    a = (uint *)ON_FixedSizePool::AllocateElement(&this->m_15);
    goto LAB_0075077e;
  }
  if (local_3c < 0x20) {
    local_3c = 0x1f;
    if (this->m_31 == (void *)0x0) goto LAB_007506fd;
    ngon = (ON_MeshNgon *)this->m_31;
    this->m_31 = *(void **)ngon;
  }
  else {
    if (local_3c < 0x40) {
      local_3c = 0x3f;
      if (this->m_63 != (void *)0x0) {
        ngon = (ON_MeshNgon *)this->m_63;
        this->m_63 = *(void **)ngon;
        goto LAB_00750715;
      }
    }
    else {
      local_3c = (7 - (local_3c & 7)) + local_3c;
    }
LAB_007506fd:
    sVar2 = SizeofNgon(local_3c);
    ngon = (ON_MeshNgon *)onmalloc(sVar2 + 0x10);
  }
LAB_00750715:
  if (ngon == (ON_MeshNgon *)0x0) {
    return (ON_MeshNgon *)0x0;
  }
  a = (uint *)&ngon->m_fi;
  *(void **)ngon = this->m_active;
  lVar1._0_4_ = ngon->m_Vcount;
  lVar1._4_4_ = ngon->m_Fcount;
  if (lVar1 != 0) {
    *(ON_MeshNgon **)(*(long *)ngon + 8) = ngon;
  }
  ngon->m_vi = (uint *)0x0;
  this->m_active = ngon;
LAB_0075077e:
  if (a != (uint *)0x0) {
    a[6] = local_3c;
    *(uint **)(a + 2) = a + 7;
    if (Fcount == 0) {
      local_68 = 0;
    }
    else {
      local_68 = *(long *)(a + 2) + (ulong)Vcount * 4;
    }
    *(long *)(a + 4) = local_68;
    *a = Vcount;
    a[1] = Fcount;
  }
  return (ON_MeshNgon *)a;
}

Assistant:

ON_MeshNgon* ON_MeshNgonAllocator::AllocateNgon(
  unsigned int Vcount,
  unsigned int Fcount
  )
{
  struct ON_MeshNgonLink* link;
  ON_MeshNgon* ngon;
  unsigned int* a;
  unsigned int capacity;

  if ( Vcount < 3  )
    return 0;

  capacity = Vcount+Fcount;
  if ( capacity <= 7 )
  {
    capacity = 7;
    if ( SizeofNgon(capacity) != m_7.SizeofElement() )
      m_7.Create(SizeofNgon(capacity),0,0);
    ngon = (ON_MeshNgon*)m_7.AllocateElement();
  }
  else if ( capacity <= 15 )
  {
    capacity = 15;
    if ( SizeofNgon(capacity) != m_15.SizeofElement() )
      m_15.Create(SizeofNgon(capacity),0,0);
    ngon = (ON_MeshNgon*)m_15.AllocateElement();
  }
  else 
  {
    for(;;)
    {
      link = 0;
      if ( capacity <= 31 )
      {
        capacity = 31;
        if ( 0 != m_31 )
        {
          link = (struct ON_MeshNgonLink*)m_31;
          m_31 = link->next;
          break;
        }
      }
      else if ( capacity <= 63 )
      {
        capacity = 63;
        if ( 0 != m_63 )
        {
          link = (struct ON_MeshNgonLink*)m_63;
          m_63 = link->next;
          break;
        }
      }
      else
      {
        // make capacity % 8 = 7
        unsigned int n = (capacity % 8);
        capacity += (7-n);
      }
      link = (struct ON_MeshNgonLink*)onmalloc(sizeof(*link) + SizeofNgon(capacity));
      break;
    }
    if ( 0 == link )
      return 0;
    ngon = (ON_MeshNgon*)(link+1);
    link->next = (struct ON_MeshNgonLink*)m_active;
    if ( link->next )
      link->next->prev = link;
    link->prev = 0;
    m_active = link;
  }

  if ( 0 != ngon )
  {
    a = (unsigned int*)(ngon+1);
    *a++ = capacity;
    ngon->m_vi = a;
    ngon->m_fi = (Fcount > 0) ? (ngon->m_vi + Vcount) : 0;
    ngon->m_Vcount = Vcount;
    ngon->m_Fcount = Fcount;
    //memset(a,0xFF,capacity*sizeof(a[0])); // almost always a waste of time - user must init
  }

  return ngon;
}